

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int __thiscall
shadow::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
copy(holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this,
    EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this_00 = (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  holder(this_00,&this->value_);
  return (int)this_00;
}

Assistant:

virtual holder_base*
    copy() const override
    {
        return new holder<T>(value_);
    }